

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_impl.cc
# Opt level: O2

void absl::time_internal::cctz::time_zone::Impl::ClearTimeZoneMapTestOnly(void)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  _Deque_base<const_absl::time_internal::cctz::time_zone::Impl_*,_std::allocator<const_absl::time_internal::cctz::time_zone::Impl_*>_>
  *this;
  __node_base *p_Var2;
  
  __mutex = (pthread_mutex_t *)anon_unknown_7::TimeZoneMutex();
  std::mutex::lock((mutex *)&__mutex->__data);
  if ((anonymous_namespace)::time_zone_map_abi_cxx11_ !=
      (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::time_internal::cctz::time_zone::Impl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::time_internal::cctz::time_zone::Impl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)0x0) {
    if (ClearTimeZoneMapTestOnly()::cleared == '\0') {
      iVar1 = __cxa_guard_acquire(&ClearTimeZoneMapTestOnly()::cleared);
      if (iVar1 != 0) {
        this = (_Deque_base<const_absl::time_internal::cctz::time_zone::Impl_*,_std::allocator<const_absl::time_internal::cctz::time_zone::Impl_*>_>
                *)operator_new(0x50);
        std::
        _Deque_base<const_absl::time_internal::cctz::time_zone::Impl_*,_std::allocator<const_absl::time_internal::cctz::time_zone::Impl_*>_>
        ::_Deque_base(this);
        ClearTimeZoneMapTestOnly::cleared =
             (deque<const_absl::time_internal::cctz::time_zone::Impl_*,_std::allocator<const_absl::time_internal::cctz::time_zone::Impl_*>_>
              *)this;
        __cxa_guard_release(&ClearTimeZoneMapTestOnly()::cleared);
      }
    }
    p_Var2 = &(anonymous_namespace)::time_zone_map_abi_cxx11_->_M_before_begin;
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
      std::
      deque<const_absl::time_internal::cctz::time_zone::Impl_*,_std::allocator<const_absl::time_internal::cctz::time_zone::Impl_*>_>
      ::push_back(ClearTimeZoneMapTestOnly::cleared,(value_type *)(p_Var2 + 5));
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::time_internal::cctz::time_zone::Impl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::time_internal::cctz::time_zone::Impl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear((anonymous_namespace)::time_zone_map_abi_cxx11_);
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void time_zone::Impl::ClearTimeZoneMapTestOnly() {
  std::lock_guard<std::mutex> lock(TimeZoneMutex());
  if (time_zone_map != nullptr) {
    // Existing time_zone::Impl* entries are in the wild, so we can't delete
    // them. Instead, we move them to a private container, where they are
    // logically unreachable but not "leaked".  Future requests will result
    // in reloading the data.
    static auto* cleared = new std::deque<const time_zone::Impl*>;
    for (const auto& element : *time_zone_map) {
      cleared->push_back(element.second);
    }
    time_zone_map->clear();
  }
}